

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void deleteTable(sqlite3 *db,Table *pTable)

{
  Index *pIVar1;
  char *zName;
  Index *pNext;
  Index *pIndex;
  Table *pTable_local;
  sqlite3 *db_local;
  
  pNext = pTable->pIndex;
  while (pNext != (Index *)0x0) {
    pIVar1 = pNext->pNext;
    if (((db == (sqlite3 *)0x0) || (db->pnBytesFreed == (int *)0x0)) && (pTable->nModuleArg == 0)) {
      sqlite3HashInsert(&pNext->pSchema->idxHash,pNext->zName,(void *)0x0);
    }
    freeIndex(db,pNext);
    pNext = pIVar1;
  }
  sqlite3FkDelete(db,pTable);
  sqlite3DeleteColumnNames(db,pTable);
  sqlite3DbFree(db,pTable->zName);
  sqlite3DbFree(db,pTable->zColAff);
  sqlite3SelectDelete(db,pTable->pSelect);
  sqlite3ExprListDelete(db,pTable->pCheck);
  sqlite3VtabClear(db,pTable);
  sqlite3DbFree(db,pTable);
  return;
}

Assistant:

static void SQLITE_NOINLINE deleteTable(sqlite3 *db, Table *pTable){
  Index *pIndex, *pNext;
  TESTONLY( int nLookaside; ) /* Used to verify lookaside not used for schema */

  /* Record the number of outstanding lookaside allocations in schema Tables
  ** prior to doing any free() operations.  Since schema Tables do not use
  ** lookaside, this number should not change. */
  TESTONLY( nLookaside = (db && (pTable->tabFlags & TF_Ephemeral)==0) ?
                         db->lookaside.nOut : 0 );

  /* Delete all indices associated with this table. */
  for(pIndex = pTable->pIndex; pIndex; pIndex=pNext){
    pNext = pIndex->pNext;
    assert( pIndex->pSchema==pTable->pSchema
         || (IsVirtual(pTable) && pIndex->idxType!=SQLITE_IDXTYPE_APPDEF) );
    if( (db==0 || db->pnBytesFreed==0) && !IsVirtual(pTable) ){
      char *zName = pIndex->zName; 
      TESTONLY ( Index *pOld = ) sqlite3HashInsert(
         &pIndex->pSchema->idxHash, zName, 0
      );
      assert( db==0 || sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
      assert( pOld==pIndex || pOld==0 );
    }
    freeIndex(db, pIndex);
  }

  /* Delete any foreign keys attached to this table. */
  sqlite3FkDelete(db, pTable);

  /* Delete the Table structure itself.
  */
  sqlite3DeleteColumnNames(db, pTable);
  sqlite3DbFree(db, pTable->zName);
  sqlite3DbFree(db, pTable->zColAff);
  sqlite3SelectDelete(db, pTable->pSelect);
  sqlite3ExprListDelete(db, pTable->pCheck);
#ifndef SQLITE_OMIT_VIRTUALTABLE
  sqlite3VtabClear(db, pTable);
#endif
  sqlite3DbFree(db, pTable);

  /* Verify that no lookaside memory was used by schema tables */
  assert( nLookaside==0 || nLookaside==db->lookaside.nOut );
}